

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

VkResult Fossilize::CreateRenderPass2
                   (VkDevice device,VkRenderPassCreateInfo2 *pCreateInfo,
                   VkAllocationCallbacks *pCallbacks,VkRenderPass *pRenderPass)

{
  bool bVar1;
  VkResult VVar2;
  LogLevel LVar3;
  Device *pDVar4;
  
  pDVar4 = get_device_layer(*(VkDevice *)device);
  VVar2 = (*pDVar4->pTable->CreateRenderPass2)(device,pCreateInfo,pCallbacks,pRenderPass);
  if (VVar2 == VK_SUCCESS) {
    bVar1 = StateRecorder::record_render_pass2(pDVar4->recorder,*pRenderPass,pCreateInfo,0);
    if (!bVar1) {
      LVar3 = get_thread_log_level();
      if ((int)LVar3 < 2) {
        bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Failed to record render pass, usually caused by unsupported pNext.\n");
        if (!bVar1) {
          CreateRenderPass2();
        }
      }
    }
  }
  return VVar2;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateRenderPass2(VkDevice device, const VkRenderPassCreateInfo2 *pCreateInfo,
                                                        const VkAllocationCallbacks *pCallbacks, VkRenderPass *pRenderPass)
{
	auto *layer = get_device_layer(device);

	// Split calls since 2 and KHR variants might not be present even if the other one is.
	auto res = layer->getTable()->CreateRenderPass2(device, pCreateInfo, pCallbacks, pRenderPass);

	if (res == VK_SUCCESS)
	{
		if (!layer->getRecorder().record_render_pass2(*pRenderPass, *pCreateInfo))
			LOGW_LEVEL("Failed to record render pass, usually caused by unsupported pNext.\n");
	}
	return res;
}